

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  LogMessage *pLVar1;
  LogMessage *this_00;
  int in_ESI;
  long in_RDI;
  LogMessage *in_stack_fffffffffffffed8;
  ulong uVar2;
  LogMessage *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffef0;
  LogMessage local_d8;
  byte local_99;
  byte local_49;
  int local_c;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_49 = 0;
  local_c = in_ESI;
  if (in_ESI < 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_49 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x3e522b);
  }
  local_99 = 0;
  if (*(long *)(in_RDI + 8) == 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_99 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x3e52b6);
  }
  this_00 = (LogMessage *)(long)local_c;
  pLVar1 = (LogMessage *)std::__cxx11::string::size();
  if (pLVar1 < this_00) {
    pLVar1 = &local_d8;
    internal::LogMessage::LogMessage
              (this_00,level,(char *)pLVar1,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    internal::LogMessage::operator<<(pLVar1,(char *)in_stack_fffffffffffffed8);
    internal::LogFinisher::operator=((LogFinisher *)pLVar1,in_stack_fffffffffffffed8);
    internal::LogMessage::~LogMessage((LogMessage *)0x3e5348);
  }
  uVar2 = *(ulong *)(in_RDI + 8);
  std::__cxx11::string::size();
  std::__cxx11::string::resize(uVar2);
  return;
}

Assistant:

void StringOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK(target_ != NULL);
  GOOGLE_CHECK_LE(count, target_->size());
  target_->resize(target_->size() - count);
}